

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

void QMessageBox::about(QWidget *parent,QString *title,QString *text)

{
  QMessageBoxPrivate *this;
  QWidget *this_00;
  long in_FS_OFFSET;
  double dVar1;
  QIcon icon;
  undefined8 local_50;
  QSize local_48 [3];
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)operator_new(0x28);
  QMessageBox((QMessageBox *)this_00,Information,title,text,(StandardButtons)0x0,parent,
              (WindowFlags)0x103);
  QWidget::setAttribute(this_00,WA_DeleteOnClose,true);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::windowIcon((QWidget *)&local_30);
  local_50 = 0x4000000040;
  dVar1 = (double)QPaintDevice::devicePixelRatio();
  QIcon::pixmap(local_48,dVar1,(Mode)(QWidget *)&local_30,(State)&local_50);
  this = *(QMessageBoxPrivate **)&this_00->field_0x8;
  QLabel::setPixmap(this->iconLabel,(QPixmap *)local_48);
  this->icon = NoIcon;
  QMessageBoxPrivate::setupLayout(this);
  QPixmap::~QPixmap((QPixmap *)local_48);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00);
  QIcon::~QIcon((QIcon *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::about(QWidget *parent, const QString &title, const QString &text)
{
#ifdef Q_OS_MAC
    static QPointer<QMessageBox> oldMsgBox;

    if (oldMsgBox && oldMsgBox->text() == text) {
        oldMsgBox->show();
        oldMsgBox->raise();
        oldMsgBox->activateWindow();
        return;
    }
#endif

    QMessageBox *msgBox = new QMessageBox(Information, title, text, NoButton, parent
#ifdef Q_OS_MAC
                                          , Qt::WindowTitleHint | Qt::WindowSystemMenuHint
#endif
    );
    msgBox->setAttribute(Qt::WA_DeleteOnClose);
    QIcon icon = msgBox->windowIcon();
    msgBox->setIconPixmap(icon.pixmap(QSize(64, 64), msgBox->devicePixelRatio()));

    // should perhaps be a style hint
#ifdef Q_OS_MAC
    oldMsgBox = msgBox;
    auto *d = msgBox->d_func();
    d->buttonBox->setCenterButtons(true);
#ifdef Q_OS_IOS
    msgBox->setModal(true);
#else
    msgBox->setModal(false);
#endif
    msgBox->show();
#else
    msgBox->exec();
#endif
}